

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchFunc.cpp
# Opt level: O0

void Bmatch_PIInformation(Abc_Frame_t *pAbc)

{
  void *pvVar1;
  value_type psVar2;
  size_type sVar3;
  void *pvVar4;
  void *pvVar5;
  reference ppsVar6;
  char *pcVar7;
  bool bVar8;
  int local_5c;
  int local_58;
  int i_1;
  int r_5;
  int r_4;
  int u_1;
  int r_3;
  int r_2;
  int r_1;
  int u;
  int r;
  int j;
  int i;
  char *ioInformation2;
  char *ioInformation1;
  PI_PO_INFO *tmpInformation;
  int total2;
  int total1;
  Abc_Frame_t *pAbc_local;
  
  tmpInformation._4_4_ = 0;
  tmpInformation._0_4_ = 0;
  pvVar1 = pAbc->pInformation;
  sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                    ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x50));
  pvVar4 = operator_new__(sVar3 + 1);
  sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                    ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x68));
  pvVar5 = operator_new__(sVar3 + 1);
  sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                    ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x50));
  *(undefined1 *)((long)pvVar4 + sVar3) = 0;
  sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                    ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x68));
  *(undefined1 *)((long)pvVar5 + sVar3) = 0;
  r = 0;
  while( true ) {
    sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                      ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x50));
    bVar8 = true;
    if (sVar3 <= (ulong)(long)r) {
      sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                        ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x68));
      bVar8 = (ulong)(long)r < sVar3;
    }
    if (!bVar8) break;
    sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                      ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x50));
    if ((ulong)(long)r < sVar3) {
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x50),
                           (long)r);
      pcVar7 = Abc_ObjName((*ppsVar6)->thisObj);
      printf("%6s:                              ",pcVar7);
    }
    else {
      printf("                                     ");
    }
    sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                      ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x68));
    if ((ulong)(long)r < sVar3) {
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x68),
                           (long)r);
      pcVar7 = Abc_ObjName((*ppsVar6)->thisObj);
      printf("%6s:",pcVar7);
    }
    else {
      printf("       ");
    }
    printf("\n");
    u = 0;
    while( true ) {
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x50),
                           (long)r);
      bVar8 = true;
      if ((*ppsVar6)->numOfInfluence <= u) {
        ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                            ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                             ((long)pvVar1 + 0x68),(long)r);
        bVar8 = u < (*ppsVar6)->numOfInfluence;
      }
      if (!bVar8) break;
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x50),
                           (long)r);
      if (u < (*ppsVar6)->numOfInfluence) {
        for (r_1 = 0; sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                                        ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                         ((long)pvVar1 + 0x50)), (ulong)(long)r_1 < sVar3;
            r_1 = r_1 + 1) {
          r_2 = 0;
          while( true ) {
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                 ((long)pvVar1 + 0x50),(long)r);
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                (&(*ppsVar6)->funSupp,(long)u);
            sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size(&(*ppsVar6)->funSupp)
            ;
            if (sVar3 <= (ulong)(long)r_2) break;
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                 ((long)pvVar1 + 0x50),(long)r);
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                (&(*ppsVar6)->funSupp,(long)u);
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                (&(*ppsVar6)->funSupp,(long)r_2);
            psVar2 = *ppsVar6;
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                 ((long)pvVar1 + 0x50),(long)r_1);
            if (psVar2 == *ppsVar6) {
              *(undefined1 *)((long)pvVar4 + (long)r_1) = 0x31;
            }
            r_2 = r_2 + 1;
          }
        }
        for (r_3 = 0; sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                                        ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                         ((long)pvVar1 + 0x50)), (ulong)(long)r_3 < sVar3;
            r_3 = r_3 + 1) {
          if (*(char *)((long)pvVar4 + (long)r_3) != '1') {
            *(undefined1 *)((long)pvVar4 + (long)r_3) = 0x30;
          }
        }
        printf("        %28s",pvVar4);
        for (u_1 = 0; sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                                        ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                         ((long)pvVar1 + 0x50)), (ulong)(long)u_1 < sVar3;
            u_1 = u_1 + 1) {
          *(undefined1 *)((long)pvVar4 + (long)u_1) = 0x30;
        }
      }
      else {
        printf("                                    ");
      }
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x68),
                           (long)r);
      if (u < (*ppsVar6)->numOfInfluence) {
        for (r_4 = 0; sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                                        ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                         ((long)pvVar1 + 0x68)), (ulong)(long)r_4 < sVar3;
            r_4 = r_4 + 1) {
          r_5 = 0;
          while( true ) {
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                 ((long)pvVar1 + 0x68),(long)r);
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                (&(*ppsVar6)->funSupp,(long)u);
            sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size(&(*ppsVar6)->funSupp)
            ;
            if (sVar3 <= (ulong)(long)r_5) break;
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                 ((long)pvVar1 + 0x68),(long)r);
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                (&(*ppsVar6)->funSupp,(long)u);
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                (&(*ppsVar6)->funSupp,(long)r_5);
            psVar2 = *ppsVar6;
            ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                                ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                 ((long)pvVar1 + 0x68),(long)r_4);
            if (psVar2 == *ppsVar6) {
              *(undefined1 *)((long)pvVar5 + (long)r_4) = 0x31;
            }
            r_5 = r_5 + 1;
          }
        }
        for (i_1 = 0; sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                                        ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                                         ((long)pvVar1 + 0x68)), (ulong)(long)i_1 < sVar3;
            i_1 = i_1 + 1) {
          if (*(char *)((long)pvVar5 + (long)i_1) != '1') {
            *(undefined1 *)((long)pvVar5 + (long)i_1) = 0x30;
          }
        }
        printf("        %28s",pvVar5);
        for (local_58 = 0;
            sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                              ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)
                               ((long)pvVar1 + 0x68)), (ulong)(long)local_58 < sVar3;
            local_58 = local_58 + 1) {
          *(undefined1 *)((long)pvVar5 + (long)local_58) = 0x30;
        }
      }
      printf("\n");
      u = u + 1;
    }
    r = r + 1;
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  printf("PI supp information for two circuits : \n");
  printf("  cir1   supp     cir2   supp   \n");
  local_5c = 0;
  while( true ) {
    sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                      ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x80));
    bVar8 = true;
    if (sVar3 <= (ulong)(long)local_5c) {
      sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                        ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x98));
      bVar8 = (ulong)(long)local_5c < sVar3;
    }
    if (!bVar8) break;
    sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                      ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x80));
    if ((ulong)(long)local_5c < sVar3) {
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x80),
                           (long)local_5c);
      tmpInformation._4_4_ = (*ppsVar6)->numOfInfluence + tmpInformation._4_4_;
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x80),
                           (long)local_5c);
      pcVar7 = Abc_ObjName((*ppsVar6)->thisObj);
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x80),
                           (long)local_5c);
      printf("%6s%7d   ",pcVar7,(ulong)(uint)(*ppsVar6)->numOfInfluence);
    }
    else {
      printf("                ");
    }
    sVar3 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::size
                      ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x98));
    if ((ulong)(long)local_5c < sVar3) {
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x98),
                           (long)local_5c);
      tmpInformation._0_4_ = (*ppsVar6)->numOfInfluence + (uint)tmpInformation;
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x98),
                           (long)local_5c);
      pcVar7 = Abc_ObjName((*ppsVar6)->thisObj);
      ppsVar6 = std::vector<suppWrap_*,_std::allocator<suppWrap_*>_>::operator[]
                          ((vector<suppWrap_*,_std::allocator<suppWrap_*>_> *)((long)pvVar1 + 0x98),
                           (long)local_5c);
      printf("%6s%7d",pcVar7,(ulong)(uint)(*ppsVar6)->numOfInfluence);
    }
    else {
      printf("             ");
    }
    printf("\n");
    local_5c = local_5c + 1;
  }
  printf(" total %6d    total %6d   \n",(ulong)tmpInformation._4_4_,(ulong)(uint)tmpInformation);
  return;
}

Assistant:

void Bmatch_PIInformation ( Abc_Frame_t * pAbc )
{
    int total1 = 0, total2 = 0;
    PI_PO_INFO *        tmpInformation;
    tmpInformation = (PI_PO_INFO *)pAbc->pInformation;
    char       *        ioInformation1, * ioInformation2;
    ioInformation1 = new char[tmpInformation->_f.size() + 1];
    ioInformation2 = new char[tmpInformation->_g.size() + 1];
    ioInformation1[tmpInformation->_f.size()] = '\0';
    ioInformation2[tmpInformation->_g.size()] = '\0';

        for( int i = 0; i < tmpInformation->_f.size() || i < tmpInformation->_g.size(); ++i ) {
            if( i < tmpInformation->_f.size() )
                printf("%6s:                              ", Abc_ObjName((tmpInformation->_f)[i]->thisObj));
            else
                printf("                                     ");
            if( i < tmpInformation->_g.size() )
                printf("%6s:", Abc_ObjName((tmpInformation->_g)[i]->thisObj));
            else
                printf("       ");
            printf("\n");
            for( int j = 0; j < (tmpInformation->_f)[i]->numOfInfluence || j < (tmpInformation->_g)[i]->numOfInfluence; ++j ) {
                if( j < (tmpInformation->_f)[i]->numOfInfluence ) {
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        for( int u = 0; u < (tmpInformation->_f)[i]->funSupp[j]->funSupp.size(); ++u ) {
                            if( (tmpInformation->_f)[i]->funSupp[j]->funSupp[u] == (tmpInformation->_f)[r] ) {
                                ioInformation1[r] = '1';
                            }
                        }
                    }
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        if( ioInformation1[r] != '1' ) {
                            ioInformation1[r] = '0';
                        }
                    }
                    printf("        %28s", ioInformation1 );
                    for( int r = 0; r < (tmpInformation->_f).size(); ++r ) {
                        ioInformation1[r] = '0';
                    }
                }
                else printf("                                    ");
                if( j < (tmpInformation->_g)[i]->numOfInfluence ) {
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        for( int u = 0; u < (tmpInformation->_g)[i]->funSupp[j]->funSupp.size(); ++u ) {
                            if( (tmpInformation->_g)[i]->funSupp[j]->funSupp[u] == (tmpInformation->_g)[r] ) {
                                ioInformation2[r] = '1';
                            }
                        }
                    }
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        if( ioInformation2[r] != '1' ) {
                            ioInformation2[r] = '0';
                        }
                    }
                    printf("        %28s", ioInformation2 );
                    for( int r = 0; r < (tmpInformation->_g).size(); ++r ) {
                        ioInformation2[r] = '0';
                    }
                }
                printf("\n");
            }
        }
    delete [] ioInformation1;
    delete [] ioInformation2;

//
    printf("PI supp information for two circuits : \n");
    printf("  cir1   supp     cir2   supp   \n");
    for( int i = 0; i < tmpInformation->_x.size() || i < tmpInformation->_y.size(); ++i ) {
        if( i < tmpInformation->_x.size() ) {
            total1 += (tmpInformation->_x)[i]->numOfInfluence;
            printf("%6s%7d   ", Abc_ObjName((tmpInformation->_x)[i]->thisObj), \
                                 (tmpInformation->_x)[i]->numOfInfluence );
        }
        else printf("                ");
        if( i < tmpInformation->_y.size() ) {
            total2 += (tmpInformation->_y)[i]->numOfInfluence;
            printf("%6s%7d", Abc_ObjName((tmpInformation->_y)[i]->thisObj), \
                              (tmpInformation->_y)[i]->numOfInfluence );
        }
        else printf("             ");
        printf("\n");
    }
    printf(" total %6d    total %6d   \n", total1, total2 );
}